

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream> __thiscall
kj::
heap<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,kj::Own<kj::AsyncInputStream>,kj::Promise<void>>
          (kj *this,Own<kj::AsyncInputStream> *params,Promise<void> *params_1)

{
  AsyncInputStream *pAVar1;
  PromiseNode *pPVar2;
  undefined8 *puVar3;
  DelayedEofInputStream *extraout_RDX;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream> OVar4;
  Own<kj::AsyncInputStream> local_38;
  Own<kj::_::PromiseNode> local_28;
  
  puVar3 = (undefined8 *)operator_new(0x30);
  local_38.disposer = params->disposer;
  pAVar1 = params->ptr;
  params->ptr = (AsyncInputStream *)0x0;
  local_28.disposer = (params_1->super_PromiseBase).node.disposer;
  pPVar2 = (params_1->super_PromiseBase).node.ptr;
  (params_1->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  *puVar3 = &PTR_read_0042be40;
  puVar3[1] = local_38.disposer;
  puVar3[2] = pAVar1;
  local_38.ptr = (AsyncInputStream *)0x0;
  *(undefined1 *)(puVar3 + 3) = 1;
  puVar3[4] = local_28.disposer;
  local_28.ptr = (PromiseNode *)0x0;
  puVar3[5] = pPVar2;
  *(undefined8 **)this =
       &_::HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>::
        instance;
  *(undefined8 **)(this + 8) = puVar3;
  Own<kj::_::PromiseNode>::dispose(&local_28);
  Own<kj::AsyncInputStream>::dispose(&local_38);
  OVar4.ptr = extraout_RDX;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}